

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O2

int GetResidualCost_SSE2(int ctx0,VP8Residual *res)

{
  byte bVar1;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  uint uVar42;
  long lVar43;
  uint16_t *puVar44;
  long lVar45;
  CostArrayPtr papuVar46;
  uint8_t auVar47 [16];
  undefined1 auVar48 [16];
  byte local_68 [4];
  byte bStack_64;
  byte bStack_63;
  byte bStack_62;
  byte bStack_61;
  byte bStack_60;
  byte bStack_5f;
  byte bStack_5e;
  byte bStack_5d;
  byte bStack_5c;
  byte bStack_5b;
  byte bStack_5a;
  byte bStack_59;
  byte local_58 [4];
  byte bStack_54;
  byte bStack_53;
  byte bStack_52;
  byte bStack_51;
  byte bStack_50;
  byte bStack_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte bStack_4c;
  byte bStack_4b;
  byte bStack_4a;
  byte bStack_49;
  uint8_t ctxs [16];
  uint8_t levels [16];
  uint16_t abs_levels [16];
  
  lVar43 = (long)res->first;
  bVar1 = res->prob[lVar43][ctx0][0];
  uVar42 = 0;
  if (ctx0 == 0) {
    uVar42 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  if ((long)res->last < 0) {
    uVar42 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar44 = res->costs[lVar43][ctx0];
    psVar2 = res->coeffs;
    sVar26 = *psVar2;
    sVar27 = psVar2[1];
    sVar28 = psVar2[2];
    sVar29 = psVar2[3];
    sVar30 = psVar2[4];
    sVar31 = psVar2[5];
    sVar32 = psVar2[6];
    sVar33 = psVar2[7];
    sVar34 = psVar2[8];
    sVar35 = psVar2[9];
    sVar36 = psVar2[10];
    sVar37 = psVar2[0xb];
    sVar38 = psVar2[0xc];
    sVar39 = psVar2[0xd];
    sVar40 = psVar2[0xe];
    sVar41 = psVar2[0xf];
    sVar18 = -sVar26;
    sVar19 = -sVar27;
    sVar20 = -sVar28;
    sVar21 = -sVar29;
    sVar22 = -sVar30;
    sVar23 = -sVar31;
    sVar24 = -sVar32;
    sVar25 = -sVar33;
    auVar47._0_2_ = (ushort)(sVar18 < sVar26) * sVar26 | (ushort)(sVar18 >= sVar26) * sVar18;
    auVar47._2_2_ = (ushort)(sVar19 < sVar27) * sVar27 | (ushort)(sVar19 >= sVar27) * sVar19;
    auVar47._4_2_ = (ushort)(sVar20 < sVar28) * sVar28 | (ushort)(sVar20 >= sVar28) * sVar20;
    auVar47._6_2_ = (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
    auVar47._8_2_ = (ushort)(sVar22 < sVar30) * sVar30 | (ushort)(sVar22 >= sVar30) * sVar22;
    auVar47._10_2_ = (ushort)(sVar23 < sVar31) * sVar31 | (ushort)(sVar23 >= sVar31) * sVar23;
    auVar47._12_2_ = (ushort)(sVar24 < sVar32) * sVar32 | (ushort)(sVar24 >= sVar32) * sVar24;
    auVar47._14_2_ = (ushort)(sVar25 < sVar33) * sVar33 | (ushort)(sVar25 >= sVar33) * sVar25;
    sVar18 = -sVar34;
    sVar19 = -sVar35;
    sVar20 = -sVar36;
    sVar21 = -sVar37;
    sVar22 = -sVar38;
    sVar23 = -sVar39;
    sVar24 = -sVar40;
    sVar25 = -sVar41;
    auVar48._0_2_ = (ushort)(sVar18 < sVar34) * sVar34 | (ushort)(sVar18 >= sVar34) * sVar18;
    auVar48._2_2_ = (ushort)(sVar19 < sVar35) * sVar35 | (ushort)(sVar19 >= sVar35) * sVar19;
    auVar48._4_2_ = (ushort)(sVar20 < sVar36) * sVar36 | (ushort)(sVar20 >= sVar36) * sVar20;
    auVar48._6_2_ = (ushort)(sVar21 < sVar37) * sVar37 | (ushort)(sVar21 >= sVar37) * sVar21;
    auVar48._8_2_ = (ushort)(sVar22 < sVar38) * sVar38 | (ushort)(sVar22 >= sVar38) * sVar22;
    auVar48._10_2_ = (ushort)(sVar23 < sVar39) * sVar39 | (ushort)(sVar23 >= sVar39) * sVar23;
    auVar48._12_2_ = (ushort)(sVar24 < sVar40) * sVar40 | (ushort)(sVar24 >= sVar40) * sVar24;
    auVar48._14_2_ = (ushort)(sVar25 < sVar41) * sVar41 | (ushort)(sVar25 >= sVar41) * sVar25;
    ctxs[0] = (uint8_t)auVar47._0_2_;
    ctxs[1] = (uint8_t)(auVar47._0_2_ >> 8);
    ctxs[2] = (uint8_t)auVar47._2_2_;
    ctxs[3] = (uint8_t)(auVar47._2_2_ >> 8);
    ctxs[4] = (uint8_t)auVar47._4_2_;
    ctxs[5] = (uint8_t)(auVar47._4_2_ >> 8);
    ctxs[6] = (uint8_t)auVar47._6_2_;
    ctxs[7] = (uint8_t)(auVar47._6_2_ >> 8);
    ctxs[8] = (uint8_t)auVar47._8_2_;
    ctxs[9] = (uint8_t)(auVar47._8_2_ >> 8);
    ctxs[10] = (uint8_t)auVar47._10_2_;
    ctxs[0xb] = (uint8_t)(auVar47._10_2_ >> 8);
    ctxs[0xc] = (uint8_t)auVar47._12_2_;
    ctxs[0xd] = (uint8_t)(auVar47._12_2_ >> 8);
    ctxs[0xe] = (uint8_t)auVar47._14_2_;
    ctxs[0xf] = (uint8_t)(auVar47._14_2_ >> 8);
    auVar48 = packsswb((undefined1  [16])auVar47,auVar48);
    bVar1 = auVar48[0];
    bVar3 = auVar48[1];
    bVar4 = auVar48[2];
    bVar5 = auVar48[3];
    bVar6 = auVar48[4];
    bVar7 = auVar48[5];
    bVar8 = auVar48[6];
    bVar9 = auVar48[7];
    bVar10 = auVar48[8];
    bVar11 = auVar48[9];
    bVar12 = auVar48[10];
    bVar13 = auVar48[0xb];
    bVar14 = auVar48[0xc];
    bVar15 = auVar48[0xd];
    bVar16 = auVar48[0xe];
    bVar17 = auVar48[0xf];
    local_68[0] = (bVar1 < 2) * bVar1 | (bVar1 >= 2) * '\x02';
    local_68[1] = (bVar3 < 2) * bVar3 | (bVar3 >= 2) * '\x02';
    local_68[2] = (bVar4 < 2) * bVar4 | (bVar4 >= 2) * '\x02';
    local_68[3] = (bVar5 < 2) * bVar5 | (bVar5 >= 2) * '\x02';
    bStack_64 = (bVar6 < 2) * bVar6 | (bVar6 >= 2) * '\x02';
    bStack_63 = (bVar7 < 2) * bVar7 | (bVar7 >= 2) * '\x02';
    bStack_62 = (bVar8 < 2) * bVar8 | (bVar8 >= 2) * '\x02';
    bStack_61 = (bVar9 < 2) * bVar9 | (bVar9 >= 2) * '\x02';
    bStack_60 = (bVar10 < 2) * bVar10 | (bVar10 >= 2) * '\x02';
    bStack_5f = (bVar11 < 2) * bVar11 | (bVar11 >= 2) * '\x02';
    bStack_5e = (bVar12 < 2) * bVar12 | (bVar12 >= 2) * '\x02';
    bStack_5d = (bVar13 < 2) * bVar13 | (bVar13 >= 2) * '\x02';
    bStack_5c = (bVar14 < 2) * bVar14 | (bVar14 >= 2) * '\x02';
    bStack_5b = (bVar15 < 2) * bVar15 | (bVar15 >= 2) * '\x02';
    bStack_5a = (bVar16 < 2) * bVar16 | (bVar16 >= 2) * '\x02';
    bStack_59 = (bVar17 < 2) * bVar17 | (bVar17 >= 2) * '\x02';
    local_58[0] = (0x43 < bVar1) * 'C' | (0x43 >= bVar1) * bVar1;
    local_58[1] = (0x43 < bVar3) * 'C' | (0x43 >= bVar3) * bVar3;
    local_58[2] = (0x43 < bVar4) * 'C' | (0x43 >= bVar4) * bVar4;
    local_58[3] = (0x43 < bVar5) * 'C' | (0x43 >= bVar5) * bVar5;
    bStack_54 = (0x43 < bVar6) * 'C' | (0x43 >= bVar6) * bVar6;
    bStack_53 = (0x43 < bVar7) * 'C' | (0x43 >= bVar7) * bVar7;
    bStack_52 = (0x43 < bVar8) * 'C' | (0x43 >= bVar8) * bVar8;
    bStack_51 = (0x43 < bVar9) * 'C' | (0x43 >= bVar9) * bVar9;
    bStack_50 = (0x43 < bVar10) * 'C' | (0x43 >= bVar10) * bVar10;
    bStack_4f = (0x43 < bVar11) * 'C' | (0x43 >= bVar11) * bVar11;
    bStack_4e = (0x43 < bVar12) * 'C' | (0x43 >= bVar12) * bVar12;
    bStack_4d = (0x43 < bVar13) * 'C' | (0x43 >= bVar13) * bVar13;
    bStack_4c = (0x43 < bVar14) * 'C' | (0x43 >= bVar14) * bVar14;
    bStack_4b = (0x43 < bVar15) * 'C' | (0x43 >= bVar15) * bVar15;
    bStack_4a = (0x43 < bVar16) * 'C' | (0x43 >= bVar16) * bVar16;
    bStack_49 = (0x43 < bVar17) * 'C' | (0x43 >= bVar17) * bVar17;
    lVar45 = lVar43 << 0x20;
    papuVar46 = res->costs + lVar43;
    for (; papuVar46 = papuVar46 + 1, lVar43 < res->last; lVar43 = lVar43 + 1) {
      uVar42 = uVar42 + VP8LevelFixedCosts[*(ushort *)(ctxs + lVar43 * 2)] +
               (uint)puVar44[local_58[lVar43]];
      puVar44 = (*papuVar46)[local_68[lVar43]];
      lVar45 = lVar45 + 0x100000000;
    }
    uVar42 = uVar42 + VP8LevelFixedCosts[*(ushort *)(ctxs + (lVar45 >> 0x1f))] +
             (uint)puVar44[local_58[lVar45 >> 0x20]];
    if (lVar43 < 0xf) {
      uVar42 = uVar42 + VP8EntropyCost
                        [res->prob[""[lVar45 + 0x100000000 >> 0x20]][local_68[lVar45 >> 0x20]][0]];
    }
  }
  return uVar42;
}

Assistant:

static int GetResidualCost_SSE2(int ctx0, const VP8Residual* const res) {
  uint8_t levels[16], ctxs[16];
  uint16_t abs_levels[16];
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }

  {   // precompute clamped levels and contexts, packed to 8b.
    const __m128i zero = _mm_setzero_si128();
    const __m128i kCst2 = _mm_set1_epi8(2);
    const __m128i kCst67 = _mm_set1_epi8(MAX_VARIABLE_LEVEL);
    const __m128i c0 = _mm_loadu_si128((const __m128i*)&res->coeffs[0]);
    const __m128i c1 = _mm_loadu_si128((const __m128i*)&res->coeffs[8]);
    const __m128i D0 = _mm_sub_epi16(zero, c0);
    const __m128i D1 = _mm_sub_epi16(zero, c1);
    const __m128i E0 = _mm_max_epi16(c0, D0);   // abs(v), 16b
    const __m128i E1 = _mm_max_epi16(c1, D1);
    const __m128i F = _mm_packs_epi16(E0, E1);
    const __m128i G = _mm_min_epu8(F, kCst2);    // context = 0,1,2
    const __m128i H = _mm_min_epu8(F, kCst67);   // clamp_level in [0..67]

    _mm_storeu_si128((__m128i*)&ctxs[0], G);
    _mm_storeu_si128((__m128i*)&levels[0], H);

    _mm_storeu_si128((__m128i*)&abs_levels[0], E0);
    _mm_storeu_si128((__m128i*)&abs_levels[8], E1);
  }
  for (; n < res->last; ++n) {
    const int ctx = ctxs[n];
    const int level = levels[n];
    const int flevel = abs_levels[n];   // full level
    cost += VP8LevelFixedCosts[flevel] + t[level];  // simplified VP8LevelCost()
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int level = levels[n];
    const int flevel = abs_levels[n];
    assert(flevel != 0);
    cost += VP8LevelFixedCosts[flevel] + t[level];
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = ctxs[n];
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}